

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfStatement.cpp
# Opt level: O1

string * __thiscall
ninx::parser::element::IfStatement::dump_abi_cxx11_
          (string *__return_storage_ptr__,IfStatement *this,int level)

{
  pointer puVar1;
  IfCase *pIVar2;
  Block *pBVar3;
  int iVar4;
  string *psVar5;
  IfStatement *pIVar6;
  long *plVar7;
  ostream *poVar8;
  long *plVar9;
  char cVar10;
  pointer puVar11;
  stringstream s;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  ulong local_1d8;
  string *local_1d0;
  IfStatement *local_1c8;
  long local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1f8[0] = local_1e8;
  local_1d8 = (ulong)(uint)level;
  std::__cxx11::string::_M_construct((ulong)local_1f8,(char)level);
  local_1d0 = __return_storage_ptr__;
  plVar7 = (long *)std::__cxx11::string::append((char *)local_1f8);
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_208 = *plVar9;
    lStack_200 = plVar7[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *plVar9;
    local_218 = (long *)*plVar7;
  }
  local_210 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_218,local_210)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  local_1c0 = (long)level;
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  puVar11 = (this->cases).
            super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->cases).
           super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1c8 = this;
  if (puVar11 != puVar1) {
    iVar4 = (int)local_1d8;
    do {
      pIVar2 = (puVar11->_M_t).
               super___uniq_ptr_impl<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>
               ._M_t.
               super__Tuple_impl<0UL,_ninx::parser::element::IfCase_*,_std::default_delete<ninx::parser::element::IfCase>_>
               .super__Head_base<0UL,_ninx::parser::element::IfCase_*,_false>._M_head_impl;
      (**(code **)((long)(pIVar2->super_ASTElement)._vptr_ASTElement + 0x18))
                (&local_218,pIVar2,iVar4 + 1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_218,local_210);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if (local_218 != &local_208) {
        operator_delete(local_218,local_208 + 1);
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar1);
  }
  pIVar6 = local_1c8;
  cVar10 = (char)local_1c0;
  if ((local_1c8->else_body)._M_t.
      super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
      ._M_t.
      super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
      .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl != (Block *)0x0) {
    local_1f8[0] = local_1e8;
    std::__cxx11::string::_M_construct((ulong)local_1f8,cVar10);
    plVar7 = (long *)std::__cxx11::string::append((char *)local_1f8);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_208 = *plVar9;
      lStack_200 = plVar7[3];
      local_218 = &local_208;
    }
    else {
      local_208 = *plVar9;
      local_218 = (long *)*plVar7;
    }
    local_210 = plVar7[1];
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_218,local_210);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
    if (local_1f8[0] != local_1e8) {
      operator_delete(local_1f8[0],local_1e8[0] + 1);
    }
    pBVar3 = (pIVar6->else_body)._M_t.
             super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
             .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl;
    (**(code **)(*(long *)&(pBVar3->super_Expression).super_Statement + 0x18))
              (&local_218,pBVar3,(int)local_1d8 + 1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_218,local_210);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
  }
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct((ulong)local_1f8,cVar10);
  plVar7 = (long *)std::__cxx11::string::append((char *)local_1f8);
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_208 = *plVar9;
    lStack_200 = plVar7[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *plVar9;
    local_218 = (long *)*plVar7;
  }
  local_210 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_218,local_210)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  psVar5 = local_1d0;
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar5;
}

Assistant:

std::string ninx::parser::element::IfStatement::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "IfStatement {" << std::endl;
    for (auto& c : cases) {
        s << c->dump(level+1) << std::endl;
    }
    if (this->else_body) {
        s << std::string(level, '\t') + "} Else {" << std::endl;
        s << this->else_body->dump(level+1) << std::endl;
    }
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}